

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O1

int parseConv(mpt_convertable *val,mpt_type_t type,void *dest)

{
  _mpt_vptr_convertable *p_Var1;
  mpt_parseIterator *it;
  
  if ((long)type < 0x43) {
    if (type == 0) {
      if (dest == (void *)0x0) {
        return 0x86;
      }
      *(uint8_t **)dest = parseConv::fmt;
      return 0;
    }
    if (type != 0x40) {
      return -3;
    }
  }
  else if (type != 0x43) {
    if (type == 0x73) {
      *(mpt_convertable **)dest = val + 10;
      return 0x73;
    }
    if (type != 0x86) {
      return -3;
    }
    if (dest == (void *)0x0) {
      return 0x73;
    }
    *(mpt_convertable **)dest = val + 1;
    return 0x73;
  }
  if (dest == (void *)0x0) {
    return 0x73;
  }
  *(mpt_convertable **)dest = val + 10;
  p_Var1 = val[8]._vptr;
  if (p_Var1 == (_mpt_vptr_convertable *)0x0) {
    p_Var1 = val[7]._vptr;
  }
  *(long *)((long)dest + 8) = (long)p_Var1 - (long)val[6]._vptr;
  return 0x73;
}

Assistant:

static int parseConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, val, _mt);
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 's', 0 };
		if (dest) {
			*((const uint8_t **) dest) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == 's') {
		*((const char **) dest) = (char *) (it + 1);
		return 's';
	}
	if (type == MPT_ENUM(TypeVector)
	    || type == MPT_type_toVector('c')) {
		struct iovec *vec;
		if ((vec = dest)) {
			vec->iov_base = it + 1;
			if (it->restore) {
				vec->iov_len = it->restore - it->val;
			} else {
				vec->iov_len = it->end - it->val;
			}
		}
		return 's';
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (dest) *((void **) dest) = &it->_it;
		return 's';
	}
	return MPT_ERROR(BadType);
}